

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  ly_ctx *ctx;
  LYS_NODE LVar1;
  int iVar2;
  lys_node *parent_00;
  size_t sVar3;
  lyd_node *plVar4;
  lys_module *plVar5;
  lys_node *node;
  lys_node **pplVar6;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0) {
LAB_00164afc:
    plVar4 = (lyd_node *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_leaf");
  }
  else {
    if (parent == (lyd_node *)0x0) {
      pplVar6 = &module->data;
LAB_00164a8f:
      node = *pplVar6;
      if (node == (lys_node *)0x0) goto LAB_00164afc;
    }
    else {
      if ((parent->schema == (lys_node *)0x0) ||
         (node = parent->schema->child, node == (lys_node *)0x0)) goto LAB_00164afc;
      LVar1 = node->nodetype;
      if (LVar1 == LYS_OUTPUT) {
        node = node->next;
        if (node == (lys_node *)0x0) goto LAB_00164afc;
        LVar1 = node->nodetype;
      }
      if (LVar1 == LYS_INPUT) {
        pplVar6 = &node->child;
        goto LAB_00164a8f;
      }
    }
    parent_00 = lys_parent(node);
    sVar3 = strlen(name);
    iVar2 = lys_getnext_data(module,parent_00,name,(int)sVar3,LYS_LEAFLIST|LYS_LEAF,0,&local_38);
    if (iVar2 == 0 && local_38 != (lys_node *)0x0) {
      plVar4 = _lyd_new_leaf(parent,local_38,val_str,0,0);
    }
    else {
      ctx = node->module->ctx;
      plVar5 = lys_node_module(node);
      plVar4 = (lyd_node *)0x0;
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",name,
             plVar5->name,node->name);
    }
  }
  return plVar4;
}

Assistant:

static struct lyd_node *
_lyd_new_leaf(struct lyd_node *parent, const struct lys_node *schema, const char *val_str, int dflt, int edit_leaf)
{
    struct lyd_node *ret;

    ret = lyd_create_leaf(schema, val_str, dflt);
    if (!ret) {
        return NULL;
    }

    /* connect to parent */
    if (parent) {
        if (lyd_insert(parent, ret)) {
            lyd_free(ret);
            return NULL;
        }
    }

    if (edit_leaf && !((struct lyd_node_leaf_list *)ret)->value_str[0]) {
        /* empty edit leaf, it is fine */
        ((struct lyd_node_leaf_list *)ret)->value_type = LY_TYPE_UNKNOWN;
        return ret;
    }

    /* resolve the type correctly (after it was connected to parent cause of log) */
    if (!lyp_parse_value(&((struct lys_node_leaf *)ret->schema)->type, &((struct lyd_node_leaf_list *)ret)->value_str,
                         NULL, (struct lyd_node_leaf_list *)ret, NULL, NULL, 1, dflt, 0)) {
        lyd_free(ret);
        return NULL;
    }

    if ((ret->schema->nodetype == LYS_LEAF) && (ret->schema->flags & LYS_UNIQUE)) {
        for (; parent && (parent->schema->nodetype != LYS_LIST); parent = parent->parent);
        if (parent) {
            parent->validity |= LYD_VAL_UNIQUE;
        } else {
            LOGINT(schema->module->ctx);
        }
    }

    return ret;
}